

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O0

void __thiscall
kainjow::mustache::
basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
basic_data(basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,value_type *string)

{
  value_type *__s;
  pointer __p;
  allocator<char> local_25 [13];
  value_type *local_18;
  value_type *string_local;
  basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  this->type_ = string;
  local_18 = string;
  string_local = (value_type *)this;
  std::
  unique_ptr<std::unordered_map<std::__cxx11::string,kainjow::mustache::basic_data<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kainjow::mustache::basic_data<std::__cxx11::string>>>>,std::default_delete<std::unordered_map<std::__cxx11::string,kainjow::mustache::basic_data<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kainjow::mustache::basic_data<std::__cxx11::string>>>>>>
  ::
  unique_ptr<std::default_delete<std::unordered_map<std::__cxx11::string,kainjow::mustache::basic_data<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kainjow::mustache::basic_data<std::__cxx11::string>>>>>,void>
            ((unique_ptr<std::unordered_map<std::__cxx11::string,kainjow::mustache::basic_data<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kainjow::mustache::basic_data<std::__cxx11::string>>>>,std::default_delete<std::unordered_map<std::__cxx11::string,kainjow::mustache::basic_data<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kainjow::mustache::basic_data<std::__cxx11::string>>>>>>
              *)&this->obj_);
  std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>::
  unique_ptr<std::default_delete<std::__cxx11::string>,void>
            ((unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>> *)
             &this->str_);
  std::
  unique_ptr<std::vector<kainjow::mustache::basic_data<std::__cxx11::string>,std::allocator<kainjow::mustache::basic_data<std::__cxx11::string>>>,std::default_delete<std::vector<kainjow::mustache::basic_data<std::__cxx11::string>,std::allocator<kainjow::mustache::basic_data<std::__cxx11::string>>>>>
  ::
  unique_ptr<std::default_delete<std::vector<kainjow::mustache::basic_data<std::__cxx11::string>,std::allocator<kainjow::mustache::basic_data<std::__cxx11::string>>>>,void>
            ((unique_ptr<std::vector<kainjow::mustache::basic_data<std::__cxx11::string>,std::allocator<kainjow::mustache::basic_data<std::__cxx11::string>>>,std::default_delete<std::vector<kainjow::mustache::basic_data<std::__cxx11::string>,std::allocator<kainjow::mustache::basic_data<std::__cxx11::string>>>>>
              *)&this->list_);
  std::
  unique_ptr<std::function<std::__cxx11::string()>,std::default_delete<std::function<std::__cxx11::string()>>>
  ::unique_ptr<std::default_delete<std::function<std::__cxx11::string()>>,void>
            ((unique_ptr<std::function<std::__cxx11::string()>,std::default_delete<std::function<std::__cxx11::string()>>>
              *)&this->partial_);
  std::
  unique_ptr<kainjow::mustache::basic_lambda_t<std::__cxx11::string>,std::default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::string>>>
  ::unique_ptr<std::default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::string>>,void>
            ((unique_ptr<kainjow::mustache::basic_lambda_t<std::__cxx11::string>,std::default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::string>>>
              *)&this->lambda_);
  __p = (pointer)operator_new(0x20);
  __s = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__p,__s,local_25);
  Catch::clara::std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reset(&this->str_,__p);
  std::allocator<char>::~allocator(local_25);
  return;
}

Assistant:

basic_data(const typename string_type::value_type* string) : type_{type::string} {
        str_.reset(new string_type(string));
    }